

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_eq_var(secp256k1_ge *a,secp256k1_ge *b)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  secp256k1_fe tmp;
  secp256k1_fe local_68;
  
  secp256k1_ge_verify(a);
  secp256k1_ge_verify(b);
  iVar2 = 0;
  if ((a->infinity == b->infinity) && (iVar2 = 1, a->infinity == 0)) {
    local_68.n[0] = (a->x).n[0];
    local_68.n[1] = (a->x).n[1];
    local_68.n[2] = (a->x).n[2];
    local_68.n[3] = (a->x).n[3];
    local_68.n[4] = (a->x).n[4];
    local_68.magnitude = (a->x).magnitude;
    local_68.normalized = (a->x).normalized;
    secp256k1_fe_verify(&local_68);
    uVar3 = (local_68.n[4] >> 0x30) * 0x1000003d1 + local_68.n[0];
    uVar4 = (uVar3 >> 0x34) + local_68.n[1];
    uVar5 = (uVar4 >> 0x34) + local_68.n[2];
    uVar6 = (uVar5 >> 0x34) + local_68.n[3];
    local_68.n[3] = uVar6 & 0xfffffffffffff;
    local_68.n[4] = (uVar6 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
    local_68.n[2] = uVar5 & 0xfffffffffffff;
    local_68.n[1] = uVar4 & 0xfffffffffffff;
    local_68.n[0] = uVar3 & 0xfffffffffffff;
    local_68.magnitude = 1;
    secp256k1_fe_verify(&local_68);
    iVar1 = secp256k1_fe_equal(&local_68,&b->x);
    iVar2 = 0;
    if (iVar1 != 0) {
      local_68.n[0] = (a->y).n[0];
      local_68.n[1] = (a->y).n[1];
      local_68.n[2] = (a->y).n[2];
      local_68.n[3] = (a->y).n[3];
      local_68.n[4] = (a->y).n[4];
      local_68.magnitude = (a->y).magnitude;
      local_68.normalized = (a->y).normalized;
      secp256k1_fe_verify(&local_68);
      uVar3 = (local_68.n[4] >> 0x30) * 0x1000003d1 + local_68.n[0];
      uVar4 = (uVar3 >> 0x34) + local_68.n[1];
      uVar5 = (uVar4 >> 0x34) + local_68.n[2];
      uVar6 = (uVar5 >> 0x34) + local_68.n[3];
      local_68.n[3] = uVar6 & 0xfffffffffffff;
      local_68.n[4] = (uVar6 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
      local_68.n[2] = uVar5 & 0xfffffffffffff;
      local_68.n[1] = uVar4 & 0xfffffffffffff;
      local_68.n[0] = uVar3 & 0xfffffffffffff;
      local_68.magnitude = 1;
      secp256k1_fe_verify(&local_68);
      iVar2 = secp256k1_fe_equal(&local_68,&b->y);
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_ge_eq_var(const secp256k1_ge *a, const secp256k1_ge *b) {
    secp256k1_fe tmp;
    SECP256K1_GE_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity != b->infinity) return 0;
    if (a->infinity) return 1;

    tmp = a->x;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->x)) return 0;

    tmp = a->y;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->y)) return 0;

    return 1;
}